

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stackstring.hpp
# Opt level: O0

bool __thiscall
nowide::basic_stackstring<char,_wchar_t,_5UL>::convert
          (basic_stackstring<char,_wchar_t,_5UL> *this,input_char_conflict *begin,
          input_char_conflict *end)

{
  size_t sVar1;
  ulong buffer_size;
  char *pcVar2;
  output_char_conflict *poVar3;
  size_t space;
  input_char_conflict *end_local;
  input_char_conflict *begin_local;
  basic_stackstring<char,_wchar_t,_5UL> *this_local;
  
  clear(this);
  sVar1 = get_space(4,1,(long)end - (long)begin >> 2);
  buffer_size = sVar1 + 1;
  if (buffer_size < 6) {
    pcVar2 = basic_convert<char,wchar_t>(this->buffer_,5,begin,end);
    if (pcVar2 == (char *)0x0) {
      clear(this);
      this_local._7_1_ = false;
    }
    else {
      this_local._7_1_ = true;
    }
  }
  else {
    poVar3 = (output_char_conflict *)operator_new__(buffer_size);
    this->mem_buffer_ = poVar3;
    pcVar2 = basic_convert<char,wchar_t>(this->mem_buffer_,buffer_size,begin,end);
    if (pcVar2 == (char *)0x0) {
      clear(this);
      this_local._7_1_ = false;
    }
    else {
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool convert(input_char const *begin,input_char const *end)
    {
        clear();

        size_t space = get_space(sizeof(input_char),sizeof(output_char),end - begin) + 1;
        if(space <= buffer_size) {
            if(basic_convert(buffer_,buffer_size,begin,end))
                return true;
            clear();
            return false;
        }
        else {
            mem_buffer_ = new output_char[space];
            if(!basic_convert(mem_buffer_,space,begin,end)) {
                clear();
                return false;
            }
            return true;
        }

    }